

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O2

extent<char> __thiscall
anon_unknown.dwarf_e092d::Diff::add
          (Diff *this,transaction_type *transaction,string *key,string *value)

{
  extent<char> eVar1;
  typed_address<char> where;
  shared_ptr<char> ptr;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  extent<char> value_extent;
  typed_address<char> *local_130;
  shared_ptr<char> *local_128;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_120;
  
  where.a_.a_ = (address)0;
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pstore::transaction_base::alloc_rw<char,void>
            ((pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&index,
             &transaction->super_transaction_base,value->_M_string_length);
  local_130 = &where;
  local_128 = &ptr;
  std::tuple<std::shared_ptr<char>&,pstore::typed_address<char>&>::operator=
            ((tuple<std::shared_ptr<char>&,pstore::typed_address<char>&> *)&local_130,
             (pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&index);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (value->_M_string_length != 0) {
    memmove(ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            (value->_M_dataplus)._M_p,value->_M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&index,&this->db_,true);
  value_extent.size = value->_M_string_length;
  value_extent.addr = where;
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
            (&local_120,
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)index.
                super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&transaction->super_transaction_base,key,&value_extent);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  ::~unique_ptr(&local_120.first.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  eVar1.size = value_extent.size;
  eVar1.addr = (typed_address<char>)(typed_address<char>)value_extent.addr.a_.a_;
  return eVar1;
}

Assistant:

pstore::extent<char> Diff::add (transaction_type & transaction, std::string const & key,
                                    std::string const & value) {
        auto where = pstore::typed_address<char>::null ();
        {
            // Allocate storage for string 'value' and copy the data into it.
            std::shared_ptr<char> ptr;
            std::tie (ptr, where) = transaction.alloc_rw<char> (value.length ());
            std::copy (std::begin (value), std::end (value), ptr.get ());
        }

        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        auto const value_extent = make_extent (where, value.length ());
        index->insert_or_assign (transaction, key, value_extent);
        return value_extent;
    }